

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<Fad<double>_>::Substitution(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  Fad<double> *pFVar1;
  TPZBaseMatrix *pTVar2;
  bool bVar3;
  Fad<double> *pFVar4;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  int64_t j_1;
  int64_t col_1;
  int64_t j;
  int64_t col;
  int64_t i;
  int64_t colb;
  int64_t rowb;
  TPZBaseMatrix *in_stack_fffffffffffffd70;
  Fad<double> *in_stack_fffffffffffffda0;
  Fad<double> *in_stack_fffffffffffffda8;
  Fad<double> *in_stack_fffffffffffffdb8;
  Fad<double> *in_stack_fffffffffffffdc0;
  undefined1 local_228 [32];
  undefined1 local_208 [48];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [48];
  undefined1 local_148 [48];
  undefined1 local_118 [32];
  Fad<double> *local_f8;
  Fad<double> *local_f0;
  undefined1 local_e8 [48];
  undefined1 local_b8 [32];
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  undefined1 local_88 [48];
  undefined1 local_58 [32];
  long local_38;
  Fad<double> *local_30;
  Fad<double> *local_28;
  int64_t local_20;
  Fad<double> *local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  local_18 = (Fad<double> *)TPZBaseMatrix::Rows(in_RSI);
  local_20 = TPZBaseMatrix::Cols(local_10);
  pFVar1 = local_18;
  pFVar4 = (Fad<double> *)TPZBaseMatrix::Rows(in_RDI);
  if (pFVar1 != pFVar4) {
    Error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  for (local_28 = (Fad<double> *)0x0; (long)local_28 < (long)local_18;
      local_28 = (Fad<double> *)
                 ((long)&((FadBinaryDiv<Fad<double>,_Fad<double>_> *)&local_28->val_)->left_ + 1)) {
    for (local_30 = (Fad<double> *)0x0; (long)local_30 < local_20;
        local_30 = (Fad<double> *)((long)&local_30->val_ + 1)) {
      for (local_38 = 0; pTVar2 = local_10, local_38 < (long)local_28; local_38 = local_38 + 1) {
        in_stack_fffffffffffffdb8 = local_28;
        in_stack_fffffffffffffdc0 = local_30;
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_88);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_b8,in_RDI,local_28,local_38);
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_e8,local_10,local_38,local_30);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        operator-<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
                  (in_stack_fffffffffffffda8,
                   (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffda0);
        Fad<double>::Fad<FadBinaryMinus<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
                  (in_stack_fffffffffffffdc0,
                   (FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_fffffffffffffdb8);
        (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (pTVar2,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0,local_58);
        Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffd70);
        FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::
        ~FadExpr((FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_fffffffffffffd70);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffd70);
        Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffd70);
        Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffd70);
        Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffd70);
      }
    }
  }
  for (local_f0 = (Fad<double> *)0x0; local_f8 = local_18, (long)local_f0 < local_20;
      local_f0 = (Fad<double> *)((long)&local_f0->val_ + 1)) {
    while (local_28 = (Fad<double> *)((long)&local_f8[-1].defaultVal + 7), -1 < (long)local_28) {
      for (; pTVar2 = local_10, (long)local_f8 < (long)local_18;
          local_f8 = (Fad<double> *)((long)&local_f8->val_ + 1)) {
        in_stack_fffffffffffffda0 = local_28;
        in_stack_fffffffffffffda8 = local_f0;
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_148);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_178,in_RDI,local_28,local_f8);
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_198,local_10,local_f8,local_f0)
        ;
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        operator-<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
                  (in_stack_fffffffffffffda8,
                   (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffda0);
        Fad<double>::Fad<FadBinaryMinus<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
                  (in_stack_fffffffffffffdc0,
                   (FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_fffffffffffffdb8);
        (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (pTVar2,in_stack_fffffffffffffda0,in_stack_fffffffffffffda8,local_118);
        Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffd70);
        FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::
        ~FadExpr((FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_fffffffffffffd70);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffd70);
        Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffd70);
        Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffd70);
        Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffd70);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_1b8,in_RDI,local_28);
      bVar3 = IsZero<Fad<double>>((Fad<double> *)in_stack_fffffffffffffd70);
      Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffd70);
      if (bVar3) {
        Error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
      pFVar4 = local_28;
      pFVar1 = local_f0;
      in_stack_fffffffffffffd70 = local_10;
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_208);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_228,in_RDI,local_28);
      operator/<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      Fad<double>::Fad<FadBinaryDiv<Fad<double>,Fad<double>>>
                (in_stack_fffffffffffffdc0,
                 (FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffdb8);
      (*(in_stack_fffffffffffffd70->super_TPZSavable)._vptr_TPZSavable[0x23])
                (in_stack_fffffffffffffd70,pFVar4,pFVar1,local_1d8);
      Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffd70);
      FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffd70);
      Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffd70);
      Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffd70);
      local_f8 = local_28;
    }
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B ) const{
	
    int64_t rowb = B->Rows();
    int64_t colb = B->Cols();
    if ( rowb != Rows() )
		Error( "SubstitutionLU <incompatible dimensions>" );
	int64_t i;
    for ( i = 0; i < rowb; i++ ) {
        for ( int64_t col = 0; col < colb; col++ ) {
            for ( int64_t j = 0; j < i; j++ ) {
                B->PutVal( i, col, B->GetVal(i, col)-GetVal(i, j) * B->GetVal(j, col) );
            }
        }
    }
    for (int64_t col=0; col<colb; col++) {
        for ( i = rowb-1; i >= 0; i-- ) {
            for ( int64_t j = i+1; j < rowb ; j++ ) {
                B->PutVal( i, col, B->GetVal(i, col) -
						  GetVal(i, j) * B->GetVal(j, col) );
            }
            if ( IsZero( GetVal(i, i) ) ) {
				Error( "BackSub( SubstitutionLU ) <Matrix is singular" );
            }
            B->PutVal( i, col, B->GetVal( i, col) / GetVal(i, i) );
		}
    }
    return( 1 );
}